

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalRoundPrecision
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *type;
  PhysicalType PVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  int iVar5;
  uint val_00;
  reference pvVar6;
  pointer pEVar7;
  pointer pEVar8;
  type expr;
  reference pvVar9;
  undefined8 *puVar10;
  ParameterNotResolvedException *this_00;
  NotImplementedException *pNVar11;
  code *pcVar12;
  Value val;
  uint8_t in_stack_ffffffffffffff2d;
  uint8_t in_stack_ffffffffffffff2e;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[6])(pEVar8);
  if ((char)iVar5 != '\0') {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  iVar5 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar8);
  if ((char)iVar5 != '\0') {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar6);
    ExpressionExecutor::EvaluateScalar(&local_b0,context,expr,false);
    LogicalType::LogicalType(&local_c8,INTEGER);
    Value::DefaultCastAs(&local_70,&local_b0,&local_c8,false);
    LogicalType::~LogicalType(&local_c8);
    Value::~Value(&local_b0);
    if (local_70.is_null != true) {
      val_00 = IntegerValue::Get(&local_70);
      type = &pEVar7->return_type;
      DecimalType::GetWidth(type);
      bVar4 = DecimalType::GetScale(type);
      if ((int)val_00 < 0) {
        PVar1 = (pEVar7->return_type).physical_type_;
        if (PVar1 == INT16) {
          pcVar12 = DecimalRoundNegativePrecisionFunction<short,duckdb::NumericHelper>;
        }
        else if (PVar1 == INT32) {
          pcVar12 = DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>;
        }
        else if (PVar1 == INT64) {
          pcVar12 = DecimalRoundNegativePrecisionFunction<long,duckdb::NumericHelper>;
        }
        else {
          pcVar12 = DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,pcVar12);
      }
      else {
        if (val_00 < bVar4) {
          NumericCastImpl<unsigned_char,_int,_false>::Convert(val_00);
          PVar1 = (pEVar7->return_type).physical_type_;
          if (PVar1 == INT64) {
            pcVar12 = DecimalRoundPositivePrecisionFunction<long,duckdb::NumericHelper>;
          }
          else if (PVar1 == INT32) {
            pcVar12 = DecimalRoundPositivePrecisionFunction<int,duckdb::NumericHelper>;
          }
          else if (PVar1 == INT16) {
            pcVar12 = DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>;
          }
          else {
            pcVar12 = DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>;
          }
        }
        else {
          pcVar12 = ScalarFunction::NopFunction;
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,pcVar12);
      }
      pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments
                          ,0);
      if (pvVar9 != type) {
        pvVar9->id_ = (pEVar7->return_type).id_;
        pvVar9->physical_type_ = (pEVar7->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar9->type_info_,&(pEVar7->return_type).type_info_);
      }
      LogicalType::DECIMAL(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2d);
      (bound_function->super_BaseScalarFunction).return_type.id_ = local_b0.type_.id_;
      (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
           local_b0.type_.physical_type_;
      peVar2 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_b0.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (bound_function->super_BaseScalarFunction).return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_b0.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_b0.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      local_b0.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var3;
      LogicalType::~LogicalType(&local_b0.type_);
      puVar10 = (undefined8 *)operator_new(0x10);
      *puVar10 = &PTR__FunctionData_02473c68;
      *(uint *)(puVar10 + 1) = val_00;
      *(undefined8 **)this = puVar10;
      Value::~Value(&local_70);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_b0.type_._0_8_ =
         &local_b0.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "ROUND(DECIMAL, INTEGER) with non-constant precision is not supported","");
    NotImplementedException::NotImplementedException(pNVar11,(string *)&local_b0);
    __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pNVar11 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_70.type_._0_8_ = (long)&local_70 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "ROUND(DECIMAL, INTEGER) with non-constant precision is not supported","");
  NotImplementedException::NotImplementedException(pNVar11,(string *)&local_70);
  __cxa_throw(pNVar11,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindDecimalRoundPrecision(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {
	auto &decimal_type = arguments[0]->return_type;
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw NotImplementedException("ROUND(DECIMAL, INTEGER) with non-constant precision is not supported");
	}
	Value val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]).DefaultCastAs(LogicalType::INTEGER);
	if (val.IsNull()) {
		throw NotImplementedException("ROUND(DECIMAL, INTEGER) with non-constant precision is not supported");
	}
	// our new precision becomes the round value
	// e.g. ROUND(DECIMAL(18,3), 1) -> DECIMAL(18,1)
	// but ONLY if the round value is positive
	// if it is negative the scale becomes zero
	// i.e. ROUND(DECIMAL(18,3), -1) -> DECIMAL(18,0)
	int32_t round_value = IntegerValue::Get(val);
	uint8_t target_scale;
	auto width = DecimalType::GetWidth(decimal_type);
	auto scale = DecimalType::GetScale(decimal_type);
	if (round_value < 0) {
		target_scale = 0;
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = DecimalRoundNegativePrecisionFunction<int16_t, NumericHelper>;
			break;
		case PhysicalType::INT32:
			bound_function.function = DecimalRoundNegativePrecisionFunction<int32_t, NumericHelper>;
			break;
		case PhysicalType::INT64:
			bound_function.function = DecimalRoundNegativePrecisionFunction<int64_t, NumericHelper>;
			break;
		default:
			bound_function.function = DecimalRoundNegativePrecisionFunction<hugeint_t, Hugeint>;
			break;
		}
	} else {
		if (round_value >= (int32_t)scale) {
			// if round_value is bigger than or equal to scale we do nothing
			bound_function.function = ScalarFunction::NopFunction;
			target_scale = scale;
		} else {
			target_scale = NumericCast<uint8_t>(round_value);
			switch (decimal_type.InternalType()) {
			case PhysicalType::INT16:
				bound_function.function = DecimalRoundPositivePrecisionFunction<int16_t, NumericHelper>;
				break;
			case PhysicalType::INT32:
				bound_function.function = DecimalRoundPositivePrecisionFunction<int32_t, NumericHelper>;
				break;
			case PhysicalType::INT64:
				bound_function.function = DecimalRoundPositivePrecisionFunction<int64_t, NumericHelper>;
				break;
			default:
				bound_function.function = DecimalRoundPositivePrecisionFunction<hugeint_t, Hugeint>;
				break;
			}
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, target_scale);
	return make_uniq<RoundPrecisionFunctionData>(round_value);
}